

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<capnp::MessageReaderAndFds>::Maybe
          (Maybe<capnp::MessageReaderAndFds> *this,Maybe<capnp::MessageReaderAndFds> *other)

{
  NullableValue<capnp::MessageReaderAndFds> *other_00;
  Maybe<capnp::MessageReaderAndFds> *other_local;
  Maybe<capnp::MessageReaderAndFds> *this_local;
  
  other_00 = mv<kj::_::NullableValue<capnp::MessageReaderAndFds>>(&other->ptr);
  kj::_::NullableValue<capnp::MessageReaderAndFds>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }